

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall
google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault::
~FeatureSetDefaults_FeatureSetEditionDefault(FeatureSetDefaults_FeatureSetEditionDefault *this)

{
  InternalMetadata *this_00;
  FeatureSet *pFVar1;
  ulong uVar2;
  LogMessageFatal local_20 [16];
  
  uVar2 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar2 & 1) != 0) {
    this_00 = &(this->super_Message).super_MessageLite._internal_metadata_;
    internal::InternalMetadata::DeleteOutOfLineHelper<google::protobuf::UnknownFieldSet>(this_00);
    uVar2 = this_00->ptr_;
  }
  if ((uVar2 & 1) != 0) {
    uVar2 = *(ulong *)(uVar2 & 0xfffffffffffffffe);
  }
  if (uVar2 == 0) {
    pFVar1 = (this->field_0)._impl_.overridable_features_;
    if (pFVar1 != (FeatureSet *)0x0) {
      FeatureSet::~FeatureSet(pFVar1);
    }
    operator_delete(pFVar1,0x48);
    pFVar1 = (this->field_0)._impl_.fixed_features_;
    if (pFVar1 != (FeatureSet *)0x0) {
      FeatureSet::~FeatureSet(pFVar1);
    }
    operator_delete(pFVar1,0x48);
    return;
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            (local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/descriptor.pb.cc"
             ,0x35d0,0x1b,"this_.GetArena() == nullptr");
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_20);
}

Assistant:

FeatureSetDefaults_FeatureSetEditionDefault::~FeatureSetDefaults_FeatureSetEditionDefault() {
  // @@protoc_insertion_point(destructor:google.protobuf.FeatureSetDefaults.FeatureSetEditionDefault)
  SharedDtor(*this);
}